

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void heightOfSelect(Select *pSelect,int *pnHeight)

{
  ExprList *in_RSI;
  int *in_RDI;
  Select *p;
  
  for (; in_RDI != (int *)0x0; in_RDI = *(int **)(in_RDI + 0x14)) {
    heightOfExpr(*(Expr **)(in_RDI + 0xc),&in_RSI->nExpr);
    heightOfExpr(*(Expr **)(in_RDI + 0x10),&in_RSI->nExpr);
    heightOfExpr(*(Expr **)(in_RDI + 0x18),&in_RSI->nExpr);
    heightOfExprList(in_RSI,in_RDI);
    heightOfExprList(in_RSI,in_RDI);
    heightOfExprList(in_RSI,in_RDI);
  }
  return;
}

Assistant:

static void heightOfSelect(Select *pSelect, int *pnHeight){
  Select *p;
  for(p=pSelect; p; p=p->pPrior){
    heightOfExpr(p->pWhere, pnHeight);
    heightOfExpr(p->pHaving, pnHeight);
    heightOfExpr(p->pLimit, pnHeight);
    heightOfExprList(p->pEList, pnHeight);
    heightOfExprList(p->pGroupBy, pnHeight);
    heightOfExprList(p->pOrderBy, pnHeight);
  }
}